

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

edata_t * arena_slab_alloc(tsdn_t *tsdn,arena_t *arena,szind_t binind,uint binshard,
                          bin_info_t *bin_info)

{
  uint64_t uVar1;
  ehooks_t *peVar2;
  size_t sVar3;
  edata_t *peVar4;
  undefined4 in_register_0000000c;
  _Bool guarded;
  _Bool deferred_work_generated;
  long local_38;
  
  local_38 = CONCAT44(in_register_0000000c,binshard);
  deferred_work_generated = false;
  peVar2 = duckdb_je_arena_get_ehooks(arena);
  if (duckdb_je_opt_san_guard_small == 0) {
    guarded = false;
  }
  else {
    guarded = false;
    if ((tsdn != (tsdn_t *)0x0) &&
       (guarded = false,
       (extent_hooks_t *)(peVar2->ptr).repr == &duckdb_je_ehooks_default_extent_hooks)) {
      uVar1 = (tsdn->tsd).
              cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small;
      guarded = uVar1 == 1;
      sVar3 = duckdb_je_opt_san_guard_small;
      if (!guarded) {
        sVar3 = uVar1 - 1;
      }
      (tsdn->tsd).
      cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small = sVar3;
    }
  }
  peVar4 = duckdb_je_pa_alloc(tsdn,&arena->pa_shard,bin_info->slab_size,0x1000,true,binind,false,
                              guarded,&deferred_work_generated);
  if (deferred_work_generated == true) {
    duckdb_je_arena_handle_deferred_work(tsdn,arena);
  }
  if (peVar4 != (edata_t *)0x0) {
    peVar4->e_bits =
         (ulong)bin_info->nregs << 0x1c | local_38 << 0x26 | peVar4->e_bits & 0xfffff0000fffffff;
    duckdb_je_bitmap_init((bitmap_t *)&peVar4->field_6,&bin_info->bitmap_info,false);
  }
  return peVar4;
}

Assistant:

static edata_t *
arena_slab_alloc(tsdn_t *tsdn, arena_t *arena, szind_t binind, unsigned binshard,
    const bin_info_t *bin_info) {
	bool deferred_work_generated = false;
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	bool guarded = san_slab_extent_decide_guard(tsdn,
	    arena_get_ehooks(arena));
	edata_t *slab = pa_alloc(tsdn, &arena->pa_shard, bin_info->slab_size,
	    /* alignment */ PAGE, /* slab */ true, /* szind */ binind,
	     /* zero */ false, guarded, &deferred_work_generated);

	if (deferred_work_generated) {
		arena_handle_deferred_work(tsdn, arena);
	}

	if (slab == NULL) {
		return NULL;
	}
	assert(edata_slab_get(slab));

	/* Initialize slab internals. */
	slab_data_t *slab_data = edata_slab_data_get(slab);
	edata_nfree_binshard_set(slab, bin_info->nregs, binshard);
	bitmap_init(slab_data->bitmap, &bin_info->bitmap_info, false);

	return slab;
}